

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O2

void __thiscall
indigox::algorithm::AStarOptimisation::PopulateInitialDistribution
          (AStarOptimisation *this,p_AStarQueueItem *d)

{
  ulong *puVar1;
  ElectronOpt *pEVar2;
  byte bVar3;
  AdjList *g;
  reference pvVar4;
  element_type *peVar5;
  reference pvVar6;
  mapped_type *__k;
  mapped_type_conflict1 *pmVar7;
  uint uVar8;
  allocator<unsigned_long> local_89;
  __shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2> local_68;
  MolVertPair startID;
  
  pEVar2 = (this->super_ElectronOptimisationAlgorithm).parent_;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&startID,
             (long)(pEVar2->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pEVar2->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,0,&local_89);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&((d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->distribution,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&startID);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&startID);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (&((d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->distribution);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&startID,
             *(size_t *)
              ((long)&((((((this->super_ElectronOptimisationAlgorithm).parent_)->elnGraph_).
                         super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super__ElnGraph).graph_.
                       super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super_type + 0x28),0,&local_89);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&((d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->unchangeable,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&startID);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&startID);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
            (&((d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->unchangeable);
  for (uVar8 = 0;
      (ulong)uVar8 <
      (((d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->unchangeable).m_num_bits; uVar8 = uVar8 + 1) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (&this->uniqueIDs_,(ulong)uVar8);
    if (*pvVar4 != '\0') {
      bVar3 = (byte)uVar8 & 0x3f;
      puVar1 = (ulong *)((long)(((d->
                                 super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->unchangeable).m_bits.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + (ulong)(uVar8 >> 6) * 8);
      *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
    }
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&startID,
             *(size_t *)
              ((long)&((((((this->super_ElectronOptimisationAlgorithm).parent_)->elnGraph_).
                         super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super__ElnGraph).graph_.
                       super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super_type + 0x28),0,&local_89);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&((d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->calculable,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&startID);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&startID);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (&((d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->calculable);
  std::__shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             &d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>)
  ;
  DetermineCalculable(this,(p_AStarQueueItem *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&startID,
             &((d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->calculable);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&((d->
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->new_calculable,
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&startID);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&startID);
  ((d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
  parent_path_cost = 0;
  std::__shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,
             &d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>)
  ;
  CalculatePathEnergy(this,(p_AStarQueueItem *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  peVar5 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar5->path_cost != Options::AssignElectrons::INF) {
    std::__shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,
               &d->
                super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>);
    CalculateHeuristicEnergy(this,(p_AStarQueueItem *)&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    peVar5 = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
  }
  peVar5->nbr_start_idx = 0;
  pEVar2 = (this->super_ElectronOptimisationAlgorithm).parent_;
  if ((pEVar2->possibleLocations_).
      super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (pEVar2->possibleLocations_).
      super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    peVar5->nbr_count = '\0';
  }
  else {
    pvVar6 = std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::at
                       (&pEVar2->possibleLocations_,0);
    startID.first = pvVar6->first;
    startID.second = pvVar6->second;
    __k = std::
          map<std::pair<void_*,_void_*>,_void_*,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
          ::at(&this->idsToVertex_,&startID);
    pmVar7 = std::
             map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
             ::at(&this->vert2pos_,__k);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (&this->uniqueIDs_,*pmVar7);
    ((d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ->nbr_count = *pvVar4;
  }
  return;
}

Assistant:

void AStarOptimisation::PopulateInitialDistribution(p_AStarQueueItem d) {
  d->distribution = ElnDist(parent_->possibleLocations_.size());
  d->distribution.reset();
  
  d->unchangeable = VertMask(parent_->elnGraph_->NumVertices());
  d->unchangeable.set();
  for (unsigned int i = 0; i < d->unchangeable.size(); ++i) {
    if (uniqueIDs_.at(i) > 0)
      d->unchangeable.reset(i);
  }
  
  d->calculable = VertMask(parent_->elnGraph_->NumVertices());
  d->calculable.reset();
  DetermineCalculable(d);
  d->new_calculable = VertMask(d->calculable);
  
  d->parent_path_cost = 0;
  CalculatePathEnergy(d);
  if (d->path_cost != opt_::INF) CalculateHeuristicEnergy(d);
  
  d->nbr_start_idx = 0;
  if (parent_->possibleLocations_.size()) {
    MolVertPair startID = parent_->possibleLocations_.at(0);
    size_t startVert = vert2pos_.at(idsToVertex_.at(startID));
    d->nbr_count = (uint32_t)uniqueIDs_.at(startVert);
  } else d->nbr_count = 0;
}